

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

int Abc_FlowRetime_PartialSat(Vec_Ptr_t *vNodes,int cut)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_58;
  int result;
  int j;
  int i;
  Abc_Obj_t *pPo;
  Abc_Obj_t *pPartNext;
  Abc_Obj_t *pPartObj;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pInitNtk;
  Abc_Ntk_t *pPartNtk;
  int cut_local;
  Vec_Ptr_t *vNodes_local;
  
  pNtk = pManMR->pInitNtk;
  iVar1 = Abc_NtkPoNum(pNtk);
  if (iVar1 != 1) {
    __assert_fail("Abc_NtkPoNum( pInitNtk ) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x3c1,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
  }
  pNtkNew = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,0);
  result = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vNodes);
    if (iVar1 <= result) {
      pAVar2 = Abc_NtkCreatePo(pNtkNew);
      pAVar3 = Abc_NtkPo(pNtk,0);
      pAVar3 = Abc_ObjFanin0(pAVar3);
      pAVar3 = Abc_ObjCopy(pAVar3);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        Abc_ObjAddFanin(pAVar2,pAVar3);
        Abc_NtkAddDummyPoNames(pNtkNew);
        Abc_NtkAddDummyPiNames(pNtkNew);
        Abc_NtkCheck(pNtkNew);
        iVar1 = Abc_NtkMiterSat(pNtkNew,500000,50000000,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
        Abc_NtkDelete(pNtkNew);
        return (int)((iVar1 != 0 ^ 0xffU) & 1);
      }
      __assert_fail("pPartNext",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x3e2,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
    }
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,result);
    *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xfff | result << 0xc;
    iVar1 = Abc_ObjIsPo(pAVar2);
    if (iVar1 != 0) {
      __assert_fail("!Abc_ObjIsPo( pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x3c8,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
    }
    if ((result < cut) && ((*(uint *)&pAVar2->field_0x14 >> 4 & 1) == 0)) {
      pPartNext = Abc_NtkCreatePi(pNtkNew);
      Abc_ObjSetCopy(pAVar2,pPartNext);
    }
    else {
      pPartNext = Abc_NtkDupObj(pNtkNew,pAVar2,0);
      *(uint *)&pPartNext->field_0x14 =
           *(uint *)&pPartNext->field_0x14 & 0xffffff7f |
           (*(uint *)&pAVar2->field_0x14 >> 7 & 1) << 7;
      for (local_58 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_58 < iVar1; local_58 = local_58 + 1)
      {
        pAVar3 = Abc_ObjFanin(pAVar2,local_58);
        pAVar3 = Abc_ObjCopy(pAVar3);
        if (pAVar3 == (Abc_Obj_t *)0x0) {
          __assert_fail("pPartNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x3d6,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
        }
        Abc_ObjAddFanin(pPartNext,pAVar3);
      }
    }
    if ((Abc_Obj_t *)(pAVar2->field_6).pTemp != pPartNext) break;
    result = result + 1;
  }
  __assert_fail("pObj->pCopy == pPartObj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                ,0x3db,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
}

Assistant:

int Abc_FlowRetime_PartialSat(Vec_Ptr_t *vNodes, int cut) {
  Abc_Ntk_t *pPartNtk, *pInitNtk = pManMR->pInitNtk;
  Abc_Obj_t *pObj, *pNext, *pPartObj, *pPartNext, *pPo;
  int i, j, result;

  assert( Abc_NtkPoNum( pInitNtk ) == 1 );

  pPartNtk = Abc_NtkAlloc( pInitNtk->ntkType, pInitNtk->ntkFunc, 0 );

  // copy network
  Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i ) {
    pObj->Level = i;
    assert(!Abc_ObjIsPo( pObj ));

    if (i < cut && !pObj->fMarkA) {
      pPartObj = Abc_NtkCreatePi( pPartNtk );
      Abc_ObjSetCopy( pObj, pPartObj );
    } else {
      // copy node
      pPartObj = Abc_NtkDupObj( pPartNtk, pObj, 0 );
      // copy complementation
      pPartObj->fPhase = pObj->fPhase;
   
      // connect fanins
      Abc_ObjForEachFanin( pObj, pNext, j ) {   
        pPartNext = Abc_ObjCopy( pNext );
        assert(pPartNext);
        Abc_ObjAddFanin( pPartObj, pPartNext );
      }
    }

    assert(pObj->pCopy == pPartObj);
  }
  
  // create PO
  pPo = Abc_NtkCreatePo( pPartNtk );
  pNext = Abc_ObjFanin0( Abc_NtkPo( pInitNtk, 0 ) );
  pPartNext = Abc_ObjCopy( pNext );
  assert( pPartNext );
  Abc_ObjAddFanin( pPo, pPartNext );
  
  // check network
#if defined(DEBUG_CHECK)
  Abc_NtkAddDummyPoNames(pPartNtk);
  Abc_NtkAddDummyPiNames(pPartNtk);
  Abc_NtkCheck( pPartNtk );
#endif

  result = Abc_NtkMiterSat( pPartNtk, (ABC_INT64_T)500000, (ABC_INT64_T)50000000, 0, NULL, NULL );

  Abc_NtkDelete( pPartNtk );
 
  return !result;
}